

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

CURLMcode multi_addtimeout(Curl_easy *data,curltime *stamp,expire_id eid)

{
  undefined8 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  curl_llist *list;
  time_node *ne;
  size_t sVar4;
  timediff_t tVar5;
  curltime older;
  curltime newer;
  timediff_t diff;
  time_node *check;
  curl_llist *timeoutlist;
  size_t n;
  curl_llist_element *prev;
  time_node *node;
  curl_llist_element *e;
  expire_id eid_local;
  curltime *stamp_local;
  Curl_easy *data_local;
  
  n = 0;
  list = &(data->state).timeoutlist;
  ne = (data->state).expires + eid;
  (ne->time).tv_sec = stamp->tv_sec;
  uVar3 = *(undefined4 *)&stamp->field_0xc;
  (ne->time).tv_usec = stamp->tv_usec;
  *(undefined4 *)&(ne->time).field_0xc = uVar3;
  ne->eid = eid;
  sVar4 = Curl_llist_count(list);
  if (sVar4 != 0) {
    node = (time_node *)list->head;
    while ((node != (time_node *)0x0 &&
           (uVar1 = (ne->time).tv_sec, uVar2 = (ne->time).tv_usec, older.tv_usec = uVar2,
           older.tv_sec = uVar1, older._12_4_ = 0, newer._12_4_ = 0,
           newer._0_12_ = *(undefined1 (*) [12])((long)(node->list).ptr + 0x18),
           tVar5 = Curl_timediff(newer,older), tVar5 < 1))) {
      n = (size_t)node;
      node = (time_node *)(node->list).next;
    }
  }
  Curl_llist_insert_next(list,(curl_llist_element *)n,ne,&ne->list);
  return CURLM_OK;
}

Assistant:

static CURLMcode
multi_addtimeout(struct Curl_easy *data,
                 struct curltime *stamp,
                 expire_id eid)
{
  struct curl_llist_element *e;
  struct time_node *node;
  struct curl_llist_element *prev = NULL;
  size_t n;
  struct curl_llist *timeoutlist = &data->state.timeoutlist;

  node = &data->state.expires[eid];

  /* copy the timestamp and id */
  memcpy(&node->time, stamp, sizeof(*stamp));
  node->eid = eid; /* also marks it as in use */

  n = Curl_llist_count(timeoutlist);
  if(n) {
    /* find the correct spot in the list */
    for(e = timeoutlist->head; e; e = e->next) {
      struct time_node *check = (struct time_node *)e->ptr;
      timediff_t diff = Curl_timediff(check->time, node->time);
      if(diff > 0)
        break;
      prev = e;
    }

  }
  /* else
     this is the first timeout on the list */

  Curl_llist_insert_next(timeoutlist, prev, node, &node->list);
  return CURLM_OK;
}